

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::FConfigFile(FConfigFile *this)

{
  FConfigFile *this_local;
  
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_00b69410;
  FString::FString(&this->PathName);
  this->CurrentSection = (FConfigSection *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  this->CurrentEntry = (FConfigEntry *)0x0;
  FString::operator=(&this->PathName,"");
  this->OkayToWrite = true;
  this->FileExisted = true;
  return;
}

Assistant:

FConfigFile::FConfigFile ()
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	PathName = "";
	OkayToWrite = true;
	FileExisted = true;
}